

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2DataBuilder::writeDataFile
          (Normalizer2DataBuilder *this,char *filename,bool writeRemoved)

{
  short sVar1;
  UChar32 UVar2;
  int iVar3;
  UBool UVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  FILE *__stream;
  Norm *pNVar9;
  undefined8 extraout_RAX;
  byte bVar10;
  byte bVar11;
  UnicodeString *s1;
  UnicodeString *pUVar12;
  UnicodeString *s2;
  MappingType MVar13;
  int32_t offset;
  byte bVar14;
  UChar32 UVar15;
  MappingType MVar16;
  MappingType MVar17;
  UnicodeSetIterator ccIter;
  UnicodeSetIterator mIter;
  int local_dc;
  int local_d0;
  UnicodeSetIterator local_b8;
  UnicodeSetIterator local_70;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    writeDataFile();
    UnicodeSetIterator::~UnicodeSetIterator(&local_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((((this->unicodeVersion[0] != '\0') || (this->unicodeVersion[1] != '\0')) ||
      (this->unicodeVersion[2] != '\0')) || (this->unicodeVersion[3] != '\0')) {
    u_versionToString_63(this->unicodeVersion,(char *)&local_b8);
    fprintf(__stream,"* Unicode %s\n\n",&local_b8);
  }
  UnicodeSetIterator::UnicodeSetIterator(&local_b8,(UnicodeSet *)this);
  local_d0 = -1;
  bVar6 = false;
  bVar5 = false;
  iVar8 = -1;
  bVar14 = 0;
  do {
    UVar4 = UnicodeSetIterator::next(&local_b8);
    UVar2 = local_b8.codepoint;
    UVar15 = 0x110000;
    if ((UVar4 == '\0') || (local_b8.codepoint == -1)) {
      bVar10 = 0;
      bVar6 = true;
    }
    else {
      pNVar9 = Norms::getNormRef(&this->norms,local_b8.codepoint);
      bVar10 = pNVar9->cc;
      UVar15 = UVar2;
    }
    bVar11 = bVar14;
    iVar3 = local_d0;
    if ((bVar10 != bVar14 || UVar15 != iVar8 + 1) && (bVar11 = bVar10, iVar3 = UVar15, bVar14 != 0))
    {
      if (local_d0 == iVar8) {
        fprintf(__stream,"%04lX:%d\n",(long)local_d0,(ulong)bVar14);
      }
      else {
        fprintf(__stream,"%04lX..%04lX:%d\n",(long)local_d0,(long)iVar8);
      }
      bVar5 = true;
    }
    local_d0 = iVar3;
    iVar8 = UVar15;
    bVar14 = bVar11;
  } while (!bVar6);
  if (bVar5) {
    fputs("\n",__stream);
  }
  UnicodeSetIterator::UnicodeSetIterator(&local_70,&(this->norms).mappingSet);
  local_dc = -1;
  bVar5 = false;
  s2 = (UnicodeString *)0x0;
  MVar13 = NONE;
  iVar8 = -1;
  do {
    UVar4 = UnicodeSetIterator::next(&local_70);
    UVar2 = local_70.codepoint;
    UVar15 = 0x110000;
    if ((UVar4 == '\0') || (local_70.codepoint == -1)) {
      bVar5 = true;
      pNVar9 = (Norm *)0x0;
    }
    else {
      pNVar9 = Norms::getNorm(&this->norms,local_70.codepoint);
      UVar15 = UVar2;
    }
    if ((pNVar9 == (Norm *)0x0) || (MVar16 = pNVar9->mappingType, MVar16 == NONE)) {
      s1 = (UnicodeString *)0x0;
      MVar16 = NONE;
    }
    else {
      s1 = pNVar9->mapping;
    }
    if ((MVar16 != MVar13) ||
       (bVar6 = anon_unknown_1::equalStrings(s1,s2), pUVar12 = s2, MVar17 = MVar13, iVar3 = local_dc
       , !bVar6 || UVar15 != iVar8 + 1)) {
      pUVar12 = s1;
      MVar17 = MVar16;
      iVar3 = UVar15;
      if (writeRemoved) {
        if (MVar13 != NONE) {
LAB_001dea66:
          if (local_dc == iVar8) {
            fprintf(__stream,"%04lX%c",(long)local_dc,(ulong)(uint)(int)"?-=>"[MVar13]);
          }
          else {
            fprintf(__stream,"%04lX..%04lX%c",(long)local_dc,(long)iVar8,
                    (ulong)(uint)(int)"?-=>"[MVar13]);
          }
          if ((s2 != (UnicodeString *)0x0) &&
             (0x1f < (ushort)(s2->fUnion).fStackFields.fLengthAndFlags)) {
            uVar7 = UnicodeString::char32At(s2,0);
            fprintf(__stream,"%04lX",(long)(int)uVar7);
            offset = 2 - (uint)(uVar7 < 0x10000);
            sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar8 = (s2->fUnion).fFields.fLength;
            }
            else {
              iVar8 = (int)sVar1 >> 5;
            }
            for (; offset < iVar8; offset = (offset - (uint)(uVar7 < 0x10000)) + 2) {
              uVar7 = UnicodeString::char32At(s2,offset);
              fprintf(__stream," %04lX",(long)(int)uVar7);
              sVar1 = (s2->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar8 = (s2->fUnion).fFields.fLength;
              }
              else {
                iVar8 = (int)sVar1 >> 5;
              }
            }
          }
          fputs("\n",__stream);
        }
      }
      else if (1 < (int)MVar13) goto LAB_001dea66;
    }
    local_dc = iVar3;
    s2 = pUVar12;
    MVar13 = MVar17;
    iVar8 = UVar15;
    if (bVar5) {
      fclose(__stream);
      UnicodeSetIterator::~UnicodeSetIterator(&local_70);
      UnicodeSetIterator::~UnicodeSetIterator(&local_b8);
      return;
    }
  } while( true );
}

Assistant:

void
Normalizer2DataBuilder::writeDataFile(const char *filename, bool writeRemoved) const {
    // Do not processData() before writing the input-syntax data file.
    FILE *f = fopen(filename, "w");
    if(f == nullptr) {
        fprintf(stderr, "gennorm2/writeDataFile() error: unable to create the output file %s\n",
                filename);
        exit(U_FILE_ACCESS_ERROR);
        return;
    }

    if(unicodeVersion[0] != 0 || unicodeVersion[1] != 0 ||
            unicodeVersion[2] != 0 || unicodeVersion[3] != 0) {
        char uv[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, uv);
        fprintf(f, "* Unicode %s\n\n", uv);
    }

    UnicodeSetIterator ccIter(norms.ccSet);
    UChar32 start = U_SENTINEL;
    UChar32 end = U_SENTINEL;
    uint8_t prevCC = 0;
    bool done = false;
    bool didWrite = false;
    do {
        UChar32 c;
        uint8_t cc;
        if(ccIter.next() && !ccIter.isString()) {
            c = ccIter.getCodepoint();
            cc = norms.getCC(c);
        } else {
            c = 0x110000;
            cc = 0;
            done = true;
        }
        if(cc == prevCC && c == (end + 1)) {
            end = c;
        } else {
            if(prevCC != 0) {
                if(start == end) {
                    fprintf(f, "%04lX:%d\n", (long)start, (int)prevCC);
                } else {
                    fprintf(f, "%04lX..%04lX:%d\n", (long)start, (long)end, (int)prevCC);
                }
                didWrite = true;
            }
            start = end = c;
            prevCC = cc;
        }
    } while(!done);
    if(didWrite) {
        fputs("\n", f);
    }

    UnicodeSetIterator mIter(norms.mappingSet);
    start = U_SENTINEL;
    end = U_SENTINEL;
    const UnicodeString *prevMapping = nullptr;
    Norm::MappingType prevType = Norm::NONE;
    done = false;
    do {
        UChar32 c;
        const Norm *norm;
        if(mIter.next() && !mIter.isString()) {
            c = mIter.getCodepoint();
            norm = norms.getNorm(c);
        } else {
            c = 0x110000;
            norm = nullptr;
            done = true;
        }
        const UnicodeString *mapping;
        Norm::MappingType type;
        if(norm == nullptr) {
            mapping = nullptr;
            type = Norm::NONE;
        } else {
            type = norm->mappingType;
            if(type == Norm::NONE) {
                mapping = nullptr;
            } else {
                mapping = norm->mapping;
            }
        }
        if(type == prevType && equalStrings(mapping, prevMapping) && c == (end + 1)) {
            end = c;
        } else {
            if(writeRemoved ? prevType != Norm::NONE : prevType > Norm::REMOVED) {
                if(start == end) {
                    fprintf(f, "%04lX%c", (long)start, typeChars[prevType]);
                } else {
                    fprintf(f, "%04lX..%04lX%c", (long)start, (long)end, typeChars[prevType]);
                }
                writeMapping(f, prevMapping);
            }
            start = end = c;
            prevMapping = mapping;
            prevType = type;
        }
    } while(!done);

    fclose(f);
}